

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfLearnConstraint(Qbf_Man_t *p,Vec_Int_t *vValues)

{
  int iVar1;
  uint i;
  int Lits [2];
  
  if (vValues->nSize != p->nPars) {
    __assert_fail("Vec_IntSize(vValues) == p->nPars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x31d,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
  }
  printf("  Pattern   ");
  Vec_IntPrintBinary(vValues);
  putchar(10);
  i = 0;
  do {
    if (vValues->nSize <= (int)i) {
      if (vValues->nSize == p->nPars) {
        return;
      }
      __assert_fail("Vec_IntSize(vValues) == p->nPars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x332,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
    }
    iVar1 = Vec_IntEntry(vValues,i);
    Lits[0] = Abc_Var2Lit(i,iVar1);
    iVar1 = sat_solver_solve(p->pSatSyn,Lits,Lits + 1,0,0,0,0);
    printf("  Var =%4d ",(ulong)i);
    if (iVar1 == 1) {
      Gia_QbfOnePattern(p,p->vLits);
      Vec_IntPrintBinary(p->vLits);
      putchar(10);
    }
    else {
      puts("UNSAT");
      Lits[0] = Abc_LitNot(Lits[0]);
      iVar1 = sat_solver_addclause(p->pSatSyn,Lits,Lits + 1);
      if (iVar1 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x32b,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_QbfLearnConstraint( Qbf_Man_t * p, Vec_Int_t * vValues )
{
    int i, status, Entry, Lits[2];
    assert( Vec_IntSize(vValues) == p->nPars );
    printf( "  Pattern   " );
    Vec_IntPrintBinary( vValues );
    printf( "\n" );
    Vec_IntForEachEntry( vValues, Entry, i )
    {
        Lits[0] = Abc_Var2Lit( i, Entry );
        status = sat_solver_solve( p->pSatSyn, Lits, Lits+1, 0, 0, 0, 0 );
        printf( "  Var =%4d ", i );
        if ( status != l_True )
        {
            printf( "UNSAT\n" );
            Lits[0] = Abc_LitNot(Lits[0]);
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
            continue;
        }
        Gia_QbfOnePattern( p, p->vLits );
        Vec_IntPrintBinary( p->vLits );
        printf( "\n" );
    }
    assert( Vec_IntSize(vValues) == p->nPars );
}